

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O0

void diy::Serialization<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::save
               (BinaryBuffer *bb,Vector *v)

{
  size_type sVar1;
  BinaryBuffer *bb_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  unsigned_long *in_RDI;
  size_t s;
  unsigned_long *in_stack_ffffffffffffffd8;
  BinaryBuffer *in_stack_ffffffffffffffe0;
  
  sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RSI);
  save<unsigned_long>(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (sVar1 != 0) {
    bb_00 = (BinaryBuffer *)
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RSI,0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RSI);
    save<unsigned_long>(bb_00,in_RDI,0x19e74b);
  }
  return;
}

Assistant:

static void         save(BinaryBuffer& bb, const Vector& v)
    {
      size_t s = v.size();
      diy::save(bb, s);
      if (s > 0)
        diy::save(bb, &v[0], v.size());
    }